

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

unique_lock<pstore::file::range_lock> * __thiscall
pstore::database::upgrade_to_write_lock(database *this)

{
  unique_lock<pstore::file::range_lock> *this_00;
  undefined1 local_40 [32];
  
  this_00 = &this->lock_;
  std::unique_lock<pstore::file::range_lock>::unlock(this_00);
  (this->lock_)._M_device = (mutex_type *)0x0;
  (this->lock_)._M_owns = false;
  pstore::file::range_lock::range_lock
            ((range_lock *)local_40,
             (this->storage_).file_.
             super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x30,8,
             exclusive_write);
  pstore::file::range_lock::operator=(&this->range_lock_,(range_lock *)local_40);
  pstore::file::range_lock::~range_lock((range_lock *)local_40);
  local_40[8] = false;
  local_40._0_8_ = &this->range_lock_;
  std::unique_lock<pstore::file::range_lock>::operator=
            (this_00,(unique_lock<pstore::file::range_lock> *)local_40);
  std::unique_lock<pstore::file::range_lock>::~unique_lock
            ((unique_lock<pstore::file::range_lock> *)local_40);
  return this_00;
}

Assistant:

std::unique_lock<file::range_lock> * database::upgrade_to_write_lock () {
        // TODO: look at exception-safety in this function.
        lock_.unlock ();
        lock_.release ();
        range_lock_ =
            get_vacuum_range_lock (this->file (), file::file_handle::lock_kind::exclusive_write);
        lock_ = std::unique_lock<file::range_lock> (range_lock_, std::defer_lock);
        return &lock_;
    }